

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

BaselineShift lunasvg::parseBaselineShift(string_view *input)

{
  basic_string_view<char,_std::char_traits<char>_> *input_00;
  int iVar1;
  Length LVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  BaselineShift BVar4;
  Length local_30;
  Length local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  string_view *input_local;
  undefined4 uStack_10;
  undefined1 local_c;
  
  local_20 = input;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(input,"baseline");
  if (iVar1 == 0) {
    BaselineShift::BaselineShift((BaselineShift *)((long)&input_local + 4),Baseline);
    uVar3 = extraout_RDX;
  }
  else {
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(local_20,"sub");
    if (iVar1 == 0) {
      BaselineShift::BaselineShift((BaselineShift *)((long)&input_local + 4),Sub);
      uVar3 = extraout_RDX_00;
    }
    else {
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(local_20,"super");
      input_00 = local_20;
      if (iVar1 == 0) {
        BaselineShift::BaselineShift((BaselineShift *)((long)&input_local + 4),Super);
        uVar3 = extraout_RDX_01;
      }
      else {
        Length::Length(&local_30,0.0,None);
        LVar2 = parseLength(input_00,Allow,&local_30);
        local_28.m_value = LVar2.m_value;
        local_28.m_units = LVar2.m_units;
        BaselineShift::BaselineShift((BaselineShift *)((long)&input_local + 4),&local_28);
        uVar3 = extraout_RDX_02;
      }
    }
  }
  BVar4.m_length._4_4_ = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),local_c);
  BVar4.m_type = input_local._4_4_;
  BVar4.m_length.m_value = (float)uStack_10;
  return BVar4;
}

Assistant:

static BaselineShift parseBaselineShift(const std::string_view& input)
{
    if(input.compare("baseline") == 0)
        return BaselineShift::Type::Baseline;
    if(input.compare("sub") == 0)
        return BaselineShift::Type::Sub;
    if(input.compare("super") == 0)
        return BaselineShift::Type::Super;
    return parseLength(input, LengthNegativeMode::Allow, Length(0.f, LengthUnits::None));
}